

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sha256.cpp
# Opt level: O3

void Sha256::Private::Transform(UInt32 *state,UInt32 *data)

{
  UInt32 *pUVar1;
  UInt32 *pUVar2;
  long lVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  UInt32 UVar7;
  UInt32 UVar8;
  UInt32 UVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint auStack_78 [4];
  UInt32 T [8];
  UInt32 W [16];
  
  local_88 = *(undefined8 *)(state + 4);
  uStack_80 = *(undefined8 *)(state + 6);
  local_98 = *(undefined8 *)state;
  uStack_90 = *(undefined8 *)(state + 2);
  uVar11 = 0;
  do {
    uVar15 = 0;
    do {
      iVar14 = (int)uVar15;
      if (uVar11 == 0) {
        uVar16 = data[uVar15];
        auStack_78[uVar15] = uVar16;
      }
      else {
        uVar16 = auStack_78[iVar14 + 0xeU & 0xf];
        uVar5 = auStack_78[iVar14 + 1U & 0xf];
        uVar16 = (uVar16 >> 10 ^ (uVar16 << 0xd | uVar16 >> 0x13) ^ (uVar16 << 0xf | uVar16 >> 0x11)
                 ) + auStack_78[iVar14 + 9U & 0xf] + auStack_78[uVar15] +
                 (uVar5 >> 3 ^ (uVar5 << 0xe | uVar5 >> 0x12) ^ (uVar5 << 0x19 | uVar5 >> 7));
        auStack_78[uVar15] = uVar16;
      }
      uVar13 = uVar15 + 1;
      uVar5 = *(uint *)((long)&local_98 + (ulong)(4U - iVar14 & 7) * 4);
      uVar6 = *(uint *)((long)&local_98 + (ulong)(6U - iVar14 & 7) * 4);
      uVar18 = (ulong)(7U - iVar14 & 7);
      iVar17 = ((uVar5 << 7 | uVar5 >> 0x19) ^
               (uVar5 << 0x15 | uVar5 >> 0xb) ^ (uVar5 << 0x1a | uVar5 >> 6)) + K[uVar15 | uVar11] +
               ((*(uint *)((long)&local_98 + (ulong)(5U - iVar14 & 7) * 4) ^ uVar6) & uVar5 ^ uVar6)
               + uVar16 + *(int *)((long)&local_98 + uVar18 * 4);
      *(int *)((long)&local_98 + uVar18 * 4) = iVar17;
      piVar4 = (int *)((long)&local_98 + (ulong)(3U - iVar14 & 7) * 4);
      *piVar4 = *piVar4 + iVar17;
      uVar16 = *(uint *)((long)&local_98 + (ulong)(-iVar14 & 7) * 4);
      uVar5 = *(uint *)((long)&local_98 + (ulong)(1U - iVar14 & 7) * 4);
      *(uint *)((long)&local_98 + uVar18 * 4) =
           ((uVar16 << 10 | uVar16 >> 0x16) ^
           (uVar16 << 0x13 | uVar16 >> 0xd) ^ (uVar16 << 0x1e | uVar16 >> 2)) +
           *(int *)((long)&local_98 + uVar18 * 4) +
           ((uVar5 | uVar16) & *(uint *)((long)&local_98 + (ulong)(2U - iVar14 & 7) * 4) |
           uVar5 & uVar16);
      uVar15 = uVar13;
    } while (uVar13 != 0x10);
    bVar19 = uVar11 < 0x30;
    uVar11 = uVar11 + 0x10;
  } while (bVar19);
  lVar12 = 0;
  do {
    pUVar1 = state + lVar12;
    UVar7 = pUVar1[1];
    UVar8 = pUVar1[2];
    UVar9 = pUVar1[3];
    lVar3 = lVar12 * 4;
    iVar14 = *(int *)((long)&local_98 + lVar3 + 4);
    iVar17 = *(int *)((long)&uStack_90 + lVar3);
    iVar10 = *(int *)((long)&uStack_90 + lVar3 + 4);
    pUVar2 = state + lVar12;
    *pUVar2 = *pUVar1 + *(int *)((long)&local_98 + lVar3);
    pUVar2[1] = UVar7 + iVar14;
    pUVar2[2] = UVar8 + iVar17;
    pUVar2[3] = UVar9 + iVar10;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 8);
  return;
}

Assistant:

static void Transform(UInt32 *state, const UInt32 *data)
  {
    UInt32 W[16];
    unsigned j;
    #ifdef _SHA256_UNROLL2
    UInt32 a,b,c,d,e,f,g,h;
    a = state[0];
    b = state[1];
    c = state[2];
    d = state[3];
    e = state[4];
    f = state[5];
    g = state[6];
    h = state[7];
    #else
    UInt32 T[8];
    for (j = 0; j < 8; j++)
      T[j] = state[j];
    #endif

    for (j = 0; j < 64; j += 16)
    {
      #if defined(_SHA256_UNROLL) || defined(_SHA256_UNROLL2)
      RX_8(0); RX_8(8);
      #else
      unsigned i;
      for (i = 0; i < 16; i++) { R(i); }
      #endif
    }

    #ifdef _SHA256_UNROLL2
    state[0] += a;
    state[1] += b;
    state[2] += c;
    state[3] += d;
    state[4] += e;
    state[5] += f;
    state[6] += g;
    state[7] += h;
    #else
    for (j = 0; j < 8; j++)
      state[j] += T[j];
    #endif
  
    /* Wipe variables */
    /* memset(W, 0, sizeof(W)); */
    /* memset(T, 0, sizeof(T)); */
  }